

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_attitude.c
# Opt level: O1

void fsnav_ins_attitude_rodrigues(void)

{
  double *pdVar1;
  char cVar2;
  fsnav_imu *pfVar3;
  fsnav_struct *pfVar4;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double a [3];
  double local_38 [4];
  double local_18;
  
  pfVar4 = fsnav;
  pfVar3 = fsnav->imu;
  dVar9 = fsnav_ins_attitude_rodrigues::t0;
  if (pfVar3 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      uVar5 = 0;
      (pfVar3->sol).q_valid = '\0';
      (pfVar3->sol).L_valid = '\0';
      (pfVar3->sol).rpy_valid = '\0';
      pdVar1 = (pfVar3->sol).L;
      fsnav_ins_attitude_rodrigues::L = pdVar1;
      (pfVar3->sol).q[0] = 1.0;
      (pfVar3->sol).q[1] = 0.0;
      (pfVar3->sol).q[2] = 0.0;
      (pfVar3->sol).q[3] = 0.0;
      (pfVar3->sol).q_valid = '\x01';
      do {
        dVar9 = 1.0;
        if ((uVar5 & 3) != 0) {
          dVar9 = 0.0;
        }
        pdVar1[uVar5] = dVar9;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 9);
      (pfVar3->sol).L_valid = '\x01';
      (pfVar3->sol).rpy[0] = (pfVar4->imu_const).pi * -0.5;
      (pfVar3->sol).rpy[1] = 0.0;
      (pfVar3->sol).rpy[2] = (pfVar4->imu_const).pi * 0.5;
      (pfVar3->sol).rpy_valid = '\x01';
      fsnav_ins_attitude_rodrigues::t0 = -1.0;
      dVar9 = fsnav_ins_attitude_rodrigues::t0;
    }
    else if ((((-1 < fsnav->mode) && ((pfVar3->sol).L_valid != '\0')) && (pfVar3->w_valid != '\0'))
            && (dVar9 = pfVar3->t, 0.0 <= fsnav_ins_attitude_rodrigues::t0)) {
      local_18 = dVar9 - fsnav_ins_attitude_rodrigues::t0;
      lVar6 = 0;
      do {
        local_38[lVar6] = pfVar3->w[lVar6] * local_18;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      fsnav_ins_attitude_rodrigues::t0 = dVar9;
      fsnav_linal_eul2mat(fsnav_ins_attitude_rodrigues::C,local_38);
      pdVar1 = fsnav_ins_attitude_rodrigues::L;
      lVar6 = -0x18;
      do {
        local_38[0] = *(double *)((long)pdVar1 + lVar6 + 0x18);
        local_38[1] = *(double *)((long)pdVar1 + lVar6 + 0x30);
        local_38[2] = *(double *)((long)pdVar1 + lVar6 + 0x48);
        *(double *)((long)pdVar1 + lVar6 + 0x18) =
             local_38[2] * fsnav_ins_attitude_rodrigues::C[2] +
             local_38[0] * fsnav_ins_attitude_rodrigues::C[0] +
             local_38[1] * fsnav_ins_attitude_rodrigues::C[1];
        *(double *)((long)pdVar1 + lVar6 + 0x30) =
             fsnav_ins_attitude_rodrigues::C[5] * local_38[2] +
             fsnav_ins_attitude_rodrigues::C[3] * local_38[0] +
             fsnav_ins_attitude_rodrigues::C[4] * local_38[1];
        *(double *)((long)pdVar1 + lVar6 + 0x48) =
             fsnav_ins_attitude_rodrigues::C[8] * local_38[2] +
             fsnav_ins_attitude_rodrigues::C[6] * local_38[0] +
             fsnav_ins_attitude_rodrigues::C[7] * local_38[1];
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0);
      pfVar3 = fsnav->imu;
      cVar2 = pfVar3->W_valid;
      lVar6 = 0;
      do {
        if (cVar2 == '\0') {
          uVar7 = 0;
          uVar8 = 0;
        }
        else {
          dVar9 = pfVar3->W[lVar6];
          uVar7 = SUB84(dVar9,0);
          uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
        }
        local_38[lVar6] = (double)CONCAT44(uVar8,uVar7);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      if ((fsnav->imu->sol).llh_valid != '\0') {
        local_38[3] = (fsnav->imu_const).u;
        dVar9 = cos((fsnav->imu->sol).llh[1]);
        local_38[1] = dVar9 * local_38[3] + local_38[1];
        local_38[3] = (fsnav->imu_const).u;
        dVar9 = sin((fsnav->imu->sol).llh[1]);
        local_38[2] = dVar9 * local_38[3] + local_38[2];
      }
      lVar6 = 0;
      do {
        local_38[lVar6] = local_38[lVar6] * local_18;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      fsnav_linal_eul2mat(fsnav_ins_attitude_rodrigues::C,local_38);
      pdVar1 = fsnav_ins_attitude_rodrigues::L;
      uVar5 = 0xfffffffffffffffd;
      do {
        local_38[0] = pdVar1[uVar5 + 3];
        local_38[1] = pdVar1[uVar5 + 4];
        local_38[2] = pdVar1[uVar5 + 5];
        pdVar1[uVar5 + 3] =
             local_38[2] * fsnav_ins_attitude_rodrigues::C[2] +
             local_38[0] * fsnav_ins_attitude_rodrigues::C[0] +
             local_38[1] * fsnav_ins_attitude_rodrigues::C[1];
        pdVar1[uVar5 + 4] =
             local_38[2] * fsnav_ins_attitude_rodrigues::C[5] +
             local_38[0] * fsnav_ins_attitude_rodrigues::C[3] +
             local_38[1] * fsnav_ins_attitude_rodrigues::C[4];
        pdVar1[uVar5 + 5] =
             local_38[2] * fsnav_ins_attitude_rodrigues::C[8] +
             local_38[0] * fsnav_ins_attitude_rodrigues::C[6] +
             local_38[1] * fsnav_ins_attitude_rodrigues::C[7];
        uVar5 = uVar5 + 3;
      } while (uVar5 < 6);
      fsnav_linal_mat2quat((fsnav->imu->sol).q,fsnav_ins_attitude_rodrigues::L);
      pfVar3 = fsnav->imu;
      (pfVar3->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar3->sol).rpy,fsnav_ins_attitude_rodrigues::L);
      (fsnav->imu->sol).rpy_valid = '\x01';
      dVar9 = fsnav_ins_attitude_rodrigues::t0;
    }
  }
  fsnav_ins_attitude_rodrigues::t0 = dVar9;
  return;
}

Assistant:

void fsnav_ins_attitude_rodrigues(void) {

	static double t0 = -1; // previous time
	static double 		   
		 C[9],             // intermediate matrix
		*L;                // pointer to attitude matrix in solution

	double 
		   dt,	           // time step
		   a[3];           // Euler rotation vector
	size_t i;              // common index variable


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// drop validity flags
		fsnav->imu->sol.  q_valid = 0;
		fsnav->imu->sol.  L_valid = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// set matrix pointer to imu->sol
		L = fsnav->imu->sol.L;	
		// identity quaternion
		for (i = 1, fsnav->imu->sol.q[0] = 1; i < 4; i++)
			fsnav->imu->sol.q[i] = 0;
		fsnav->imu->sol.  q_valid = 1;
		// identity attitude matrix
		for (i = 0; i < 9; i++)
			L[i] = ((i%4) == 0) ? 1 : 0; // for 3x3 matrix, each 4-th element is diagonal
		fsnav->imu->sol.  L_valid = 1;
		// attitude angles for identity matrix
		fsnav->imu->sol.rpy[0] = -fsnav->imu_const.pi/2;	// roll             -90 deg
		fsnav->imu->sol.rpy[1] =  0;						// pitch              0 deg
		fsnav->imu->sol.rpy[2] = +fsnav->imu_const.pi/2;	// yaw=true heading +90 deg
		fsnav->imu->sol.rpy_valid = 1;
		// reset previous time
		t0 = -1;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}
	else						// main cycle
	{
		// check for crucial data initialized
		if (!fsnav->imu->sol.L_valid || !fsnav->imu->w_valid)
			return;
		// time variables
		if (t0 < 0) { // first touch
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		// a = w*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->w[i]*dt;
		// L = (E + [a x]*sin(a)/|a| + [a x]^2*(1-cos(a))/|a|^2)*L
		fsnav_linal_eul2mat(C,a);  // C <- A = E + [a x]*sin(a)/|a| + [a x]^2*(1-cos(a))/|a|^2
		for (i = 0; i < 3; i++) { // L = A*L
			a[0] = L[0+i], a[1] = L[3+i], a[2] = L[6+i];
			L[0+i] = C[0]*a[0] + C[1]*a[1] + C[2]*a[2];
			L[3+i] = C[3]*a[0] + C[4]*a[1] + C[5]*a[2];
			L[6+i] = C[6]*a[0] + C[7]*a[1] + C[8]*a[2];
		}
		// a <- c = (W + u)*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->W_valid ? fsnav->imu->W[i] : 0;
		if (fsnav->imu->sol.llh_valid) {
			a[1] += fsnav->imu_const.u*cos(fsnav->imu->sol.llh[1]);
			a[2] += fsnav->imu_const.u*sin(fsnav->imu->sol.llh[1]);
		}
		for (i = 0; i < 3; i++)
			a[i] *= dt;
		// L = L*(E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2)^T
		fsnav_linal_eul2mat(C,a);     // C = E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2
		for (i = 0; i < 9; i += 3) { // L = L*C^T
			a[0] = L[i+0], a[1] = L[i+1], a[2] = L[i+2];
			L[i+0] = a[0]*C[0] + a[1]*C[1] + a[2]*C[2];
			L[i+1] = a[0]*C[3] + a[1]*C[4] + a[2]*C[5];
			L[i+2] = a[0]*C[6] + a[1]*C[7] + a[2]*C[8];
		}
		// renew quaternion
		fsnav_linal_mat2quat(fsnav->imu->sol.q ,L);
		fsnav->imu->sol.q_valid   = 1;
		// renew angles
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy,L);
		fsnav->imu->sol.rpy_valid = 1;

	}

}